

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setUniformValue
          (QOpenGLShaderProgram *this,char *name,GLfloat x,GLfloat y,GLfloat z)

{
  QOpenGLShaderProgram *in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  int in_XMM2_Da;
  GLfloat in_stack_ffffffffffffffe0;
  
  uniformLocation(in_RSI,(char *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
  setUniformValue((QOpenGLShaderProgram *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,
                  in_stack_ffffffffffffffe0,(GLfloat)((ulong)in_RDI >> 0x20),(GLfloat)in_RDI);
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValue
        (const char *name, GLfloat x, GLfloat y, GLfloat z)
{
    setUniformValue(uniformLocation(name), x, y, z);
}